

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::DescriptorProto::SerializeWithCachedSizesToArray
          (DescriptorProto *this,uint8 *target)

{
  uint uVar1;
  string *psVar2;
  FieldDescriptorProto *pFVar3;
  DescriptorProto *this_00;
  EnumDescriptorProto *this_01;
  DescriptorProto_ExtensionRange *this_02;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar4;
  uint32 value;
  long lVar5;
  uint8 *puVar6;
  MessageOptions *this_03;
  
  if ((this->_has_bits_[0] & 1) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,SERIALIZE);
    psVar2 = this->name_;
    *target = '\n';
    value = (uint32)psVar2->_M_string_length;
    if (value < 0x80) {
      target[1] = (uint8)psVar2->_M_string_length;
      puVar6 = target + 2;
    }
    else {
      puVar6 = io::CodedOutputStream::WriteVarint32FallbackToArray(value,target + 1);
    }
    target = io::CodedOutputStream::WriteRawToArray
                       ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,puVar6);
  }
  if (0 < (this->field_).super_RepeatedPtrFieldBase.current_size_) {
    lVar5 = 0;
    do {
      pFVar3 = (FieldDescriptorProto *)(this->field_).super_RepeatedPtrFieldBase.elements_[lVar5];
      *target = '\x12';
      uVar1 = pFVar3->_cached_size_;
      if (uVar1 < 0x80) {
        target[1] = (uint8)uVar1;
        puVar6 = target + 2;
      }
      else {
        puVar6 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar1,target + 1);
      }
      target = FieldDescriptorProto::SerializeWithCachedSizesToArray(pFVar3,puVar6);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->field_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (this->nested_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar5 = 0;
    do {
      this_00 = (DescriptorProto *)(this->nested_type_).super_RepeatedPtrFieldBase.elements_[lVar5];
      *target = '\x1a';
      uVar1 = this_00->_cached_size_;
      if (uVar1 < 0x80) {
        target[1] = (uint8)uVar1;
        puVar6 = target + 2;
      }
      else {
        puVar6 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar1,target + 1);
      }
      target = SerializeWithCachedSizesToArray(this_00,puVar6);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->nested_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (this->enum_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar5 = 0;
    do {
      this_01 = (EnumDescriptorProto *)
                (this->enum_type_).super_RepeatedPtrFieldBase.elements_[lVar5];
      *target = '\"';
      uVar1 = this_01->_cached_size_;
      if (uVar1 < 0x80) {
        target[1] = (uint8)uVar1;
        puVar6 = target + 2;
      }
      else {
        puVar6 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar1,target + 1);
      }
      target = EnumDescriptorProto::SerializeWithCachedSizesToArray(this_01,puVar6);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->enum_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (this->extension_range_).super_RepeatedPtrFieldBase.current_size_) {
    lVar5 = 0;
    do {
      this_02 = (DescriptorProto_ExtensionRange *)
                (this->extension_range_).super_RepeatedPtrFieldBase.elements_[lVar5];
      *target = '*';
      uVar1 = this_02->_cached_size_;
      if (uVar1 < 0x80) {
        target[1] = (uint8)uVar1;
        puVar6 = target + 2;
      }
      else {
        puVar6 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar1,target + 1);
      }
      target = DescriptorProto_ExtensionRange::SerializeWithCachedSizesToArray(this_02,puVar6);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->extension_range_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (this->extension_).super_RepeatedPtrFieldBase.current_size_) {
    lVar5 = 0;
    do {
      pFVar3 = (FieldDescriptorProto *)
               (this->extension_).super_RepeatedPtrFieldBase.elements_[lVar5];
      *target = '2';
      uVar1 = pFVar3->_cached_size_;
      if (uVar1 < 0x80) {
        target[1] = (uint8)uVar1;
        puVar6 = target + 2;
      }
      else {
        puVar6 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar1,target + 1);
      }
      target = FieldDescriptorProto::SerializeWithCachedSizesToArray(pFVar3,puVar6);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->extension_).super_RepeatedPtrFieldBase.current_size_);
  }
  if ((this->_has_bits_[0] & 0x40) != 0) {
    this_03 = this->options_;
    if (this_03 == (MessageOptions *)0x0) {
      this_03 = *(MessageOptions **)(default_instance_ + 0x90);
    }
    *target = ':';
    uVar1 = this_03->_cached_size_;
    if (uVar1 < 0x80) {
      target[1] = (uint8)uVar1;
      puVar6 = target + 2;
    }
    else {
      puVar6 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar1,target + 1);
    }
    target = MessageOptions::SerializeWithCachedSizesToArray(this_03,puVar6);
  }
  pvVar4 = (this->_unknown_fields_).fields_;
  if ((pvVar4 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar4->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar4->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    puVar6 = internal::WireFormat::SerializeUnknownFieldsToArray(&this->_unknown_fields_,target);
    return puVar6;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* DescriptorProto::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional string name = 1;
  if (has_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // repeated .google.protobuf.FieldDescriptorProto field = 2;
  for (int i = 0; i < this->field_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        2, this->field(i), target);
  }

  // repeated .google.protobuf.DescriptorProto nested_type = 3;
  for (int i = 0; i < this->nested_type_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        3, this->nested_type(i), target);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
  for (int i = 0; i < this->enum_type_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        4, this->enum_type(i), target);
  }

  // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
  for (int i = 0; i < this->extension_range_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        5, this->extension_range(i), target);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 6;
  for (int i = 0; i < this->extension_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        6, this->extension(i), target);
  }

  // optional .google.protobuf.MessageOptions options = 7;
  if (has_options()) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        7, this->options(), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}